

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O0

char * __thiscall
btRigidBody::serialize(btRigidBody *this,void *dataBuffer,btSerializer *serializer)

{
  btMatrix3x3FloatData *in_RDX;
  btSerializer *in_RSI;
  void *in_RDI;
  btCollisionObject *unaff_retaddr;
  btRigidBodyFloatData *rbd;
  btSerializer *this_00;
  
  this_00 = in_RSI;
  btCollisionObject::serialize(unaff_retaddr,in_RDI,in_RSI);
  btMatrix3x3::serialize((btMatrix3x3 *)this_00,in_RDX);
  btVector3::serialize((btVector3 *)((long)in_RDI + 0x17c),(btVector3FloatData *)(in_RSI + 0x140));
  btVector3::serialize((btVector3 *)((long)in_RDI + 0x18c),(btVector3FloatData *)(in_RSI + 0x150));
  *(undefined4 *)(in_RSI + 0x1d0) = *(undefined4 *)((long)in_RDI + 0x19c);
  btVector3::serialize((btVector3 *)((long)in_RDI + 0x278),(btVector3FloatData *)(in_RSI + 0x160));
  btVector3::serialize((btVector3 *)((long)in_RDI + 0x1a0),(btVector3FloatData *)(in_RSI + 0x170));
  btVector3::serialize((btVector3 *)((long)in_RDI + 0x1b0),(btVector3FloatData *)(in_RSI + 0x180));
  btVector3::serialize((btVector3 *)((long)in_RDI + 0x1c0),(btVector3FloatData *)(in_RSI + 400));
  btVector3::serialize((btVector3 *)((long)in_RDI + 0x1d0),(btVector3FloatData *)(in_RSI + 0x1a0));
  btVector3::serialize((btVector3 *)((long)in_RDI + 0x1e0),(btVector3FloatData *)(in_RSI + 0x1b0));
  btVector3::serialize((btVector3 *)((long)in_RDI + 0x1f0),(btVector3FloatData *)(in_RSI + 0x1c0));
  *(undefined4 *)(in_RSI + 0x1d4) = *(undefined4 *)((long)in_RDI + 0x200);
  *(undefined4 *)(in_RSI + 0x1d8) = *(undefined4 *)((long)in_RDI + 0x204);
  *(uint *)(in_RSI + 500) = (uint)(*(byte *)((long)in_RDI + 0x208) & 1);
  *(undefined4 *)(in_RSI + 0x1dc) = *(undefined4 *)((long)in_RDI + 0x20c);
  *(undefined4 *)(in_RSI + 0x1e0) = *(undefined4 *)((long)in_RDI + 0x210);
  *(undefined4 *)(in_RSI + 0x1e4) = *(undefined4 *)((long)in_RDI + 0x214);
  *(undefined4 *)(in_RSI + 0x1e8) = *(undefined4 *)((long)in_RDI + 0x218);
  *(undefined4 *)(in_RSI + 0x1ec) = *(undefined4 *)((long)in_RDI + 0x21c);
  *(undefined4 *)(in_RSI + 0x1f0) = *(undefined4 *)((long)in_RDI + 0x220);
  return "btRigidBodyFloatData";
}

Assistant:

const char*	btRigidBody::serialize(void* dataBuffer, class btSerializer* serializer) const
{
	btRigidBodyData* rbd = (btRigidBodyData*) dataBuffer;

	btCollisionObject::serialize(&rbd->m_collisionObjectData, serializer);

	m_invInertiaTensorWorld.serialize(rbd->m_invInertiaTensorWorld);
	m_linearVelocity.serialize(rbd->m_linearVelocity);
	m_angularVelocity.serialize(rbd->m_angularVelocity);
	rbd->m_inverseMass = m_inverseMass;
	m_angularFactor.serialize(rbd->m_angularFactor);
	m_linearFactor.serialize(rbd->m_linearFactor);
	m_gravity.serialize(rbd->m_gravity);
	m_gravity_acceleration.serialize(rbd->m_gravity_acceleration);
	m_invInertiaLocal.serialize(rbd->m_invInertiaLocal);
	m_totalForce.serialize(rbd->m_totalForce);
	m_totalTorque.serialize(rbd->m_totalTorque);
	rbd->m_linearDamping = m_linearDamping;
	rbd->m_angularDamping = m_angularDamping;
	rbd->m_additionalDamping = m_additionalDamping;
	rbd->m_additionalDampingFactor = m_additionalDampingFactor;
	rbd->m_additionalLinearDampingThresholdSqr = m_additionalLinearDampingThresholdSqr;
	rbd->m_additionalAngularDampingThresholdSqr = m_additionalAngularDampingThresholdSqr;
	rbd->m_additionalAngularDampingFactor = m_additionalAngularDampingFactor;
	rbd->m_linearSleepingThreshold=m_linearSleepingThreshold;
	rbd->m_angularSleepingThreshold = m_angularSleepingThreshold;

	return btRigidBodyDataName;
}